

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

string * __thiscall
ktx::DiffEnum<_khr_df_model_channels_e>::value_abi_cxx11_
          (string *__return_storage_ptr__,DiffEnum<_khr_df_model_channels_e> *this,size_t index,
          OutputFormat format)

{
  char *__s;
  char *pcVar1;
  char *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  size_t sStack_30;
  char *local_28 [2];
  char *local_18;
  
  __s = this->enumNames[index];
  if (format == text) {
    if (__s == (char *)0x0) {
      local_28[0] = (char *)(ulong)*(uint *)&(this->super_DiffBase<_khr_df_model_channels_e>).values
                                             [index].
                                             super__Optional_base<_khr_df_model_channels_e,_true,_true>
                                             ._M_payload.
                                             super__Optional_payload_base<_khr_df_model_channels_e>.
                                             _M_payload;
      this_00 = "0x{:x}";
      pcVar1 = (char *)0x6;
      sStack_30 = 2;
    }
    else {
      if ((this->super_DiffBase<_khr_df_model_channels_e>).field_0x39 != '\x01') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,__s,(allocator<char> *)local_28);
        return __return_storage_ptr__;
      }
      this_00 = "0x{:x} ({})";
      pcVar1 = (char *)0xb;
      sStack_30 = 0xc2;
      local_28[0] = (char *)(ulong)*(uint *)&(this->super_DiffBase<_khr_df_model_channels_e>).values
                                             [index].
                                             super__Optional_base<_khr_df_model_channels_e,_true,_true>
                                             ._M_payload.
                                             super__Optional_payload_base<_khr_df_model_channels_e>.
                                             _M_payload;
      local_18 = __s;
    }
  }
  else if (__s == (char *)0x0) {
    local_28[0] = (char *)(ulong)*(uint *)&(this->super_DiffBase<_khr_df_model_channels_e>).values
                                           [index].
                                           super__Optional_base<_khr_df_model_channels_e,_true,_true>
                                           ._M_payload.
                                           super__Optional_payload_base<_khr_df_model_channels_e>.
                                           _M_payload;
    this_00 = "{}";
    pcVar1 = (char *)0x2;
    sStack_30 = 1;
  }
  else {
    this_00 = "\"{}\"";
    pcVar1 = (char *)0x4;
    sStack_30 = 0xc;
    local_28[0] = __s;
  }
  fmt.size_ = sStack_30;
  fmt.data_ = pcVar1;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_28;
  ::fmt::v10::vformat_abi_cxx11_(__return_storage_ptr__,(v10 *)this_00,fmt,args);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string value(std::size_t index, OutputFormat format) const override {
        if (format == OutputFormat::text) {
            if (enumNames[index]) {
                if (hexInText) {
                    return fmt::format("0x{:x} ({})", uint32_t(DiffBase<T>::rawValue(index)), enumNames[index]);
                } else {
                    return enumNames[index];
                }
            } else {
                return fmt::format("0x{:x}", uint32_t(DiffBase<T>::rawValue(index)));
            }
        } else {
            if (enumNames[index]) {
                return fmt::format("\"{}\"", enumNames[index]);
            } else {
                return fmt::format("{}", int32_t(DiffBase<T>::rawValue(index)));
            }
        }
    }